

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void secure_random_fill(void *bytes,uint length)

{
  uint uVar1;
  uint in_ESI;
  void *in_stack_ffffffffffffffe8;
  
  if (secure_random_data.initialized == 0) {
    dbg_msg("secure","called secure_random_fill before secure_random_init");
    dbg_break();
  }
  uVar1 = io_read((IOHANDLE)CONCAT44(in_ESI,in_ESI),in_stack_ffffffffffffffe8,0);
  if (in_ESI != uVar1) {
    dbg_msg("secure","io_read returned with a short read");
    dbg_break();
  }
  return;
}

Assistant:

void secure_random_fill(void *bytes, unsigned length)
{
	if(!secure_random_data.initialized)
	{
		dbg_msg("secure", "called secure_random_fill before secure_random_init");
		dbg_break();
	}
#if defined(CONF_FAMILY_WINDOWS)
	if(!CryptGenRandom(secure_random_data.provider, length, bytes))
	{
		dbg_msg("secure", "CryptGenRandom failed, last_error=%lu", GetLastError());
		dbg_break();
	}
#else
	if(length != io_read(secure_random_data.urandom, bytes, length))
	{
		dbg_msg("secure", "io_read returned with a short read");
		dbg_break();
	}
#endif
}